

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klondike.c
# Opt level: O3

_Bool klondike_isWon(Board *board)

{
  GAMEID GVar1;
  Spot *pSVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0xc;
  GVar1 = (gConfig.game)->id;
  if (1 < GVar1 - 0x17) {
    if (GVar1 == DOUBLEKLONDIKETURN1) {
      uVar3 = 8;
    }
    else {
      uVar3 = (uint)(GVar1 == DOUBLEKLONDIKETURN3) * 4 + 4;
    }
  }
  uVar4 = 0;
  do {
    pSVar2 = board_spotGet(board,FOUNDATION,(uchar)uVar4);
    if (pSVar2->cardsCount != '\r') break;
    uVar4 = uVar4 + 1;
  } while (uVar4 < uVar3);
  return pSVar2->cardsCount == '\r';
}

Assistant:

bool klondike_isWon(Board * board)
{
	unsigned char i;
	unsigned char foundationCount = (gConfig.game->id==TRIPLEKLONDIKETURN1 || gConfig.game->id==TRIPLEKLONDIKETURN3 ? 12 : (gConfig.game->id==DOUBLEKLONDIKETURN1 || gConfig.game->id==DOUBLEKLONDIKETURN3 ? 8 : 4));
	Spot * foundation;
	for(i=0;i<foundationCount;i++)
	{
		foundation = board_spotGet(board, FOUNDATION, i);
		if(foundation->cardsCount!=13)
			return false;
	}

	return true;
}